

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseConst.cpp
# Opt level: O0

void __thiscall
glslang::TConstTraverser::TConstTraverser
          (TConstTraverser *this,TConstUnionArray *cUnion,bool singleConstParam,
          TOperator constructType,TType *t)

{
  TType *t_local;
  TOperator constructType_local;
  bool singleConstParam_local;
  TConstUnionArray *cUnion_local;
  TConstTraverser *this_local;
  
  TIntermTraverser::TIntermTraverser(&this->super_TIntermTraverser,true,false,false,false);
  (this->super_TIntermTraverser)._vptr_TIntermTraverser =
       (_func_int **)&PTR__TConstTraverser_013b2af0;
  TConstUnionArray::TConstUnionArray(&this->unionArray,cUnion);
  this->type = t;
  this->constructorType = constructType;
  this->singleConstantParam = singleConstParam;
  this->error = false;
  this->isMatrix = false;
  this->matrixCols = 0;
  this->matrixRows = 0;
  this->index = 0;
  this->tOp = EOpNull;
  return;
}

Assistant:

TConstTraverser(const TConstUnionArray& cUnion, bool singleConstParam, TOperator constructType, const TType& t)
      : unionArray(cUnion), type(t),
        constructorType(constructType), singleConstantParam(singleConstParam), error(false), isMatrix(false),
        matrixCols(0), matrixRows(0) {  index = 0; tOp = EOpNull; }